

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

char * mpack_node_data_alloc(mpack_node_t node,size_t maxlen)

{
  mpack_error_t error;
  void *__dest;
  char *pcVar1;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar2;
  ulong __size;
  
  tree = node.tree;
  pmVar2 = node.data;
  if (tree->error == mpack_ok) {
    if (pmVar2->type - mpack_type_array < 0xfffffffd) {
      error = mpack_error_type;
    }
    else {
      __size = (ulong)pmVar2->len;
      if (maxlen < __size) {
        error = mpack_error_too_big;
      }
      else {
        __dest = malloc(__size);
        if (__dest != (void *)0x0) {
          pcVar1 = (char *)memcpy(__dest,tree->data + (long)(pmVar2->value).children,__size);
          return pcVar1;
        }
        error = mpack_error_memory;
      }
    }
    mpack_tree_flag_error(tree,error);
  }
  return (char *)0x0;
}

Assistant:

char* mpack_node_data_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure this is a valid data type
    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)node.data->len);
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    return ret;
}